

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v4.cpp
# Opt level: O1

void __thiscall
LASwriteItemCompressed_POINT14_v4::write_gps_time
          (LASwriteItemCompressed_POINT14_v4 *this,U64I64F64 gps_time)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  LAScontextPOINT14 *pLVar4;
  uint uVar5;
  U32 UVar6;
  int iVar7;
  I32 pred;
  ArithmeticModel *pAVar8;
  IntegerCompressor *pIVar9;
  ArithmeticEncoder *pAVar10;
  int real;
  uint uVar11;
  long lVar12;
  bool bVar13;
  float fVar14;
  
  uVar1 = this->current_context;
  uVar5 = this->contexts[uVar1].last;
  iVar7 = this->contexts[uVar1].last_gpstime_diff[uVar5];
  lVar12 = gps_time.u64 - this->contexts[uVar1].last_gpstime[uVar5].u64;
  real = (int)lVar12;
  if (iVar7 == 0) {
    if (real != lVar12) {
      bVar13 = false;
      if ((gps_time.u64 - 0x80000000) - this->contexts[uVar1].last_gpstime[uVar5 + 1 & 3].u64 <
          0xffffffff00000000) {
        uVar2 = 0;
        do {
          uVar11 = uVar2;
          if (uVar11 == 2) {
            pAVar10 = this->enc_gps_time;
            pAVar8 = this->contexts[uVar1].m_gpstime_0diff;
            UVar6 = 1;
            goto LAB_0013a8ea;
          }
          uVar2 = uVar11 + 1;
        } while ((gps_time.u64 - 0x80000000) -
                 this->contexts[uVar1].last_gpstime[uVar5 + 2 + uVar11 & 3].u64 < 0xffffffff00000000
                );
        bVar13 = 2 < uVar11 + 1;
        iVar7 = uVar11 + 2;
      }
      else {
        iVar7 = 1;
      }
      pAVar10 = this->enc_gps_time;
      pAVar8 = this->contexts[uVar1].m_gpstime_0diff;
      UVar6 = iVar7 + 1;
      goto LAB_0013a7a2;
    }
    ArithmeticEncoder::encodeSymbol(this->enc_gps_time,this->contexts[uVar1].m_gpstime_0diff,0);
    IntegerCompressor::compress(this->contexts[this->current_context].ic_gpstime,0,real,0);
    pLVar4 = this->contexts + this->current_context;
    uVar3 = (ulong)this->contexts[this->current_context].last;
    pLVar4->last_gpstime_diff[uVar3] = real;
  }
  else {
    if (real != lVar12) {
      bVar13 = false;
      if ((gps_time.u64 - 0x80000000) - this->contexts[uVar1].last_gpstime[uVar5 + 1 & 3].u64 <
          0xffffffff00000000) {
        uVar2 = 0;
LAB_0013a65a:
        uVar11 = uVar2;
        if (uVar11 != 2) goto code_r0x0013a664;
        pAVar10 = this->enc_gps_time;
        pAVar8 = this->contexts[uVar1].m_gpstime_multi;
        UVar6 = 0x1ff;
LAB_0013a8ea:
        bVar13 = true;
        ArithmeticEncoder::encodeSymbol(pAVar10,pAVar8,UVar6);
        uVar1 = this->current_context;
        IntegerCompressor::compress
                  (this->contexts[uVar1].ic_gpstime,
                   *(I32 *)((long)this->contexts[uVar1].last_gpstime +
                           (ulong)this->contexts[uVar1].last * 8 + 4),(I32)((ulong)gps_time >> 0x20)
                   ,8);
        ArithmeticEncoder::writeInt(this->enc_gps_time,(U32)gps_time.u64);
        uVar1 = this->current_context;
        uVar5 = this->contexts[uVar1].next + 1 & 3;
        this->contexts[uVar1].next = uVar5;
        this->contexts[uVar1].last = uVar5;
        this->contexts[uVar1].last_gpstime_diff[uVar5] = 0;
        this->contexts[uVar1].multi_extreme_counter[uVar5] = 0;
        goto LAB_0013a976;
      }
      iVar7 = 1;
      goto LAB_0013a773;
    }
    fVar14 = (float)real / (float)iVar7;
    UVar6 = (U32)((double)fVar14 + *(double *)(&DAT_0014b8d0 + (ulong)(fVar14 < 0.0) * 8));
    if (UVar6 != 1) {
      if ((int)UVar6 < 1) {
        if ((int)UVar6 < 0) {
          pAVar8 = this->contexts[uVar1].m_gpstime_multi;
          if (-10 < (int)UVar6) {
            ArithmeticEncoder::encodeSymbol(this->enc_gps_time,pAVar8,500 - UVar6);
            uVar1 = this->current_context;
            pIVar9 = this->contexts[uVar1].ic_gpstime;
            iVar7 = UVar6 * this->contexts[uVar1].last_gpstime_diff[this->contexts[uVar1].last];
            UVar6 = 5;
            goto LAB_0013aa07;
          }
          ArithmeticEncoder::encodeSymbol(this->enc_gps_time,pAVar8,0x1fe);
          uVar1 = this->current_context;
          pIVar9 = this->contexts[uVar1].ic_gpstime;
          pred = this->contexts[uVar1].last_gpstime_diff[this->contexts[uVar1].last] * -10;
          UVar6 = 6;
        }
        else {
          ArithmeticEncoder::encodeSymbol
                    (this->enc_gps_time,this->contexts[uVar1].m_gpstime_multi,0);
          pIVar9 = this->contexts[this->current_context].ic_gpstime;
          pred = 0;
          UVar6 = 7;
        }
      }
      else {
        pAVar8 = this->contexts[uVar1].m_gpstime_multi;
        if ((int)UVar6 < 500) {
          ArithmeticEncoder::encodeSymbol(this->enc_gps_time,pAVar8,UVar6);
          uVar1 = this->current_context;
          iVar7 = this->contexts[uVar1].last_gpstime_diff[this->contexts[uVar1].last] * UVar6;
          pIVar9 = this->contexts[uVar1].ic_gpstime;
          if ((int)UVar6 < 10) {
            UVar6 = 2;
          }
          else {
            UVar6 = 3;
          }
LAB_0013aa07:
          IntegerCompressor::compress(pIVar9,iVar7,real,UVar6);
          goto LAB_0013a97b;
        }
        ArithmeticEncoder::encodeSymbol(this->enc_gps_time,pAVar8,500);
        uVar1 = this->current_context;
        pIVar9 = this->contexts[uVar1].ic_gpstime;
        pred = this->contexts[uVar1].last_gpstime_diff[this->contexts[uVar1].last] * 500;
        UVar6 = 4;
      }
      IntegerCompressor::compress(pIVar9,pred,real,UVar6);
      uVar1 = this->current_context;
      uVar5 = this->contexts[uVar1].last;
      iVar7 = this->contexts[uVar1].multi_extreme_counter[uVar5];
      this->contexts[uVar1].multi_extreme_counter[uVar5] = iVar7 + 1;
      if (2 < iVar7) {
        this->contexts[uVar1].last_gpstime_diff[uVar5] = real;
        this->contexts[uVar1].multi_extreme_counter[uVar5] = 0;
      }
      goto LAB_0013a97b;
    }
    ArithmeticEncoder::encodeSymbol(this->enc_gps_time,this->contexts[uVar1].m_gpstime_multi,1);
    uVar1 = this->current_context;
    IntegerCompressor::compress
              (this->contexts[uVar1].ic_gpstime,
               this->contexts[uVar1].last_gpstime_diff[this->contexts[uVar1].last],real,1);
    pLVar4 = this->contexts + this->current_context;
    uVar3 = (ulong)this->contexts[this->current_context].last;
  }
  pLVar4->multi_extreme_counter[uVar3] = 0;
  goto LAB_0013a97b;
code_r0x0013a664:
  uVar2 = uVar11 + 1;
  if (0xfffffffeffffffff <
      (gps_time.u64 - 0x80000000) - this->contexts[uVar1].last_gpstime[uVar5 + 2 + uVar11 & 3].u64)
  goto code_r0x0013a67f;
  goto LAB_0013a65a;
code_r0x0013a67f:
  bVar13 = 2 < uVar11 + 1;
  iVar7 = uVar11 + 2;
LAB_0013a773:
  pAVar10 = this->enc_gps_time;
  pAVar8 = this->contexts[uVar1].m_gpstime_multi;
  UVar6 = iVar7 + 0x1ff;
LAB_0013a7a2:
  ArithmeticEncoder::encodeSymbol(pAVar10,pAVar8,UVar6);
  this->contexts[this->current_context].last =
       iVar7 + this->contexts[this->current_context].last & 3;
  write_gps_time(this,gps_time);
LAB_0013a976:
  if (!bVar13) {
    return;
  }
LAB_0013a97b:
  this->contexts[this->current_context].last_gpstime[this->contexts[this->current_context].last] =
       gps_time;
  return;
}

Assistant:

void LASwriteItemCompressed_POINT14_v4::write_gps_time(const U64I64F64 gps_time)
{
  if (contexts[current_context].last_gpstime_diff[contexts[current_context].last] == 0) // if the last integer difference was zero
  {
    // calculate the difference between the two doubles as an integer
    I64 curr_gpstime_diff_64 = gps_time.i64 - contexts[current_context].last_gpstime[contexts[current_context].last].i64;
    I32 curr_gpstime_diff = (I32)curr_gpstime_diff_64;
    if (curr_gpstime_diff_64 == (I64)(curr_gpstime_diff))
    {
      enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_0diff, 0); // the difference can be represented with 32 bits
      contexts[current_context].ic_gpstime->compress(0, curr_gpstime_diff, 0);
      contexts[current_context].last_gpstime_diff[contexts[current_context].last] = curr_gpstime_diff;
      contexts[current_context].multi_extreme_counter[contexts[current_context].last] = 0; 
    }
    else // the difference is huge
    {
      U32 i;
      // maybe the double belongs to another time sequence
      for (i = 1; i < 4; i++)
      {
        I64 other_gpstime_diff_64 = gps_time.i64 - contexts[current_context].last_gpstime[(contexts[current_context].last+i)&3].i64;
        I32 other_gpstime_diff = (I32)other_gpstime_diff_64;
        if (other_gpstime_diff_64 == (I64)(other_gpstime_diff))
        {
          enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_0diff, i+1); // it belongs to another sequence 
          contexts[current_context].last = (contexts[current_context].last+i)&3;
          write_gps_time(gps_time);
          return;
        }
      }
      // no other sequence found. start new sequence.
      enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_0diff, 1); 
      contexts[current_context].ic_gpstime->compress((I32)(contexts[current_context].last_gpstime[contexts[current_context].last].u64 >> 32), (I32)(gps_time.u64 >> 32), 8);
      enc_gps_time->writeInt((U32)(gps_time.u64));
      contexts[current_context].next = (contexts[current_context].next+1)&3;
      contexts[current_context].last = contexts[current_context].next;
      contexts[current_context].last_gpstime_diff[contexts[current_context].last] = 0;
      contexts[current_context].multi_extreme_counter[contexts[current_context].last] = 0; 
    }
    contexts[current_context].last_gpstime[contexts[current_context].last].i64 = gps_time.i64;
  }
  else // the last integer difference was *not* zero
  {
    // calculate the difference between the two doubles as an integer
    I64 curr_gpstime_diff_64 = gps_time.i64 - contexts[current_context].last_gpstime[contexts[current_context].last].i64;
    I32 curr_gpstime_diff = (I32)curr_gpstime_diff_64;

    // if the current gpstime difference can be represented with 32 bits
    if (curr_gpstime_diff_64 == (I64)(curr_gpstime_diff))
    {
      // compute multiplier between current and last integer difference
      F32 multi_f = (F32)curr_gpstime_diff / (F32)(contexts[current_context].last_gpstime_diff[contexts[current_context].last]);
      I32 multi = I32_QUANTIZE(multi_f);

      // compress the residual curr_gpstime_diff in dependance on the multiplier
      if (multi == 1)
      {
        // this is the case we assume we get most often for regular spaced pulses
        enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_multi, 1);
        contexts[current_context].ic_gpstime->compress(contexts[current_context].last_gpstime_diff[contexts[current_context].last], curr_gpstime_diff, 1);
        contexts[current_context].multi_extreme_counter[contexts[current_context].last] = 0; 
      }
      else if (multi > 0)
      {
        if (multi < LASZIP_GPSTIME_MULTI) // positive multipliers up to LASZIP_GPSTIME_MULTI are compressed directly
        {
          enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_multi, multi);
          if (multi < 10)
            contexts[current_context].ic_gpstime->compress(multi*contexts[current_context].last_gpstime_diff[contexts[current_context].last], curr_gpstime_diff, 2);
          else
            contexts[current_context].ic_gpstime->compress(multi*contexts[current_context].last_gpstime_diff[contexts[current_context].last], curr_gpstime_diff, 3);
        }
        else
        {
          enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_multi, LASZIP_GPSTIME_MULTI);
          contexts[current_context].ic_gpstime->compress(LASZIP_GPSTIME_MULTI*contexts[current_context].last_gpstime_diff[contexts[current_context].last], curr_gpstime_diff, 4);
          contexts[current_context].multi_extreme_counter[contexts[current_context].last]++;
          if (contexts[current_context].multi_extreme_counter[contexts[current_context].last] > 3)
          {
            contexts[current_context].last_gpstime_diff[contexts[current_context].last] = curr_gpstime_diff;
            contexts[current_context].multi_extreme_counter[contexts[current_context].last] = 0;
          }
        }
      }
      else if (multi < 0)
      {
        if (multi > LASZIP_GPSTIME_MULTI_MINUS) // negative multipliers larger than LASZIP_GPSTIME_MULTI_MINUS are compressed directly
        {
          enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_multi, LASZIP_GPSTIME_MULTI - multi);
          contexts[current_context].ic_gpstime->compress(multi*contexts[current_context].last_gpstime_diff[contexts[current_context].last], curr_gpstime_diff, 5);
        }
        else
        {
          enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_multi, LASZIP_GPSTIME_MULTI - LASZIP_GPSTIME_MULTI_MINUS);
          contexts[current_context].ic_gpstime->compress(LASZIP_GPSTIME_MULTI_MINUS*contexts[current_context].last_gpstime_diff[contexts[current_context].last], curr_gpstime_diff, 6);
          contexts[current_context].multi_extreme_counter[contexts[current_context].last]++;
          if (contexts[current_context].multi_extreme_counter[contexts[current_context].last] > 3)
          {
            contexts[current_context].last_gpstime_diff[contexts[current_context].last] = curr_gpstime_diff;
            contexts[current_context].multi_extreme_counter[contexts[current_context].last] = 0;
          }
        }
      }
      else
      {
        enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_multi, 0);
        contexts[current_context].ic_gpstime->compress(0, curr_gpstime_diff, 7);
        contexts[current_context].multi_extreme_counter[contexts[current_context].last]++;
        if (contexts[current_context].multi_extreme_counter[contexts[current_context].last] > 3)
        {
          contexts[current_context].last_gpstime_diff[contexts[current_context].last] = curr_gpstime_diff;
          contexts[current_context].multi_extreme_counter[contexts[current_context].last] = 0;
        }
      }
    }
    else // the difference is huge
    {
      U32 i;
      // maybe the double belongs to another time sequence
      for (i = 1; i < 4; i++)
      {
        I64 other_gpstime_diff_64 = gps_time.i64 - contexts[current_context].last_gpstime[(contexts[current_context].last+i)&3].i64;
        I32 other_gpstime_diff = (I32)other_gpstime_diff_64;
        if (other_gpstime_diff_64 == (I64)(other_gpstime_diff))
        {
          // it belongs to this sequence 
          enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_multi, LASZIP_GPSTIME_MULTI_CODE_FULL+i);
          contexts[current_context].last = (contexts[current_context].last+i)&3;
          write_gps_time(gps_time);
          return;
        }
      }
      // no other sequence found. start new sequence.
      enc_gps_time->encodeSymbol(contexts[current_context].m_gpstime_multi, LASZIP_GPSTIME_MULTI_CODE_FULL);
      contexts[current_context].ic_gpstime->compress((I32)(contexts[current_context].last_gpstime[contexts[current_context].last].u64 >> 32), (I32)(gps_time.u64 >> 32), 8);
      enc_gps_time->writeInt((U32)(gps_time.u64));
      contexts[current_context].next = (contexts[current_context].next+1)&3;
      contexts[current_context].last = contexts[current_context].next;
      contexts[current_context].last_gpstime_diff[contexts[current_context].last] = 0;
      contexts[current_context].multi_extreme_counter[contexts[current_context].last] = 0; 
    }
    contexts[current_context].last_gpstime[contexts[current_context].last].i64 = gps_time.i64;
  }
}